

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::verifyEmptyImage
          (LayeredRenderCase *this,Surface *layer,bool logging)

{
  ostringstream *poVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  TestLog *this_00;
  undefined7 in_register_00000011;
  void *__buf;
  long lVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  LogImageSet local_280;
  LogImage local_240;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  if ((int)CONCAT71(in_register_00000011,logging) != 0) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expecting empty image",0x15);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  iVar2 = layer->m_height;
  if (iVar2 < 1) {
    bVar8 = true;
  }
  else {
    uVar3 = layer->m_width;
    lVar5 = 0;
    bVar8 = false;
    iVar6 = 0;
    do {
      if (0 < (int)uVar3) {
        uVar7 = 0;
        do {
          uVar4 = *(uint *)((long)(layer->m_pixels).m_ptr + (long)((int)lVar5 + (int)uVar7) * 4);
          if (((0x8ffff < (uVar4 & 0xff0000)) && (8 < (uVar4 & 0xff))) && (0x8ff < (uVar4 & 0xff00))
             ) {
            if (!logging) {
              return bVar8;
            }
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Found (at least) one bad pixel at ",0x22);
            std::ostream::operator<<(poVar1,(int)uVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
            std::ostream::operator<<(poVar1,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,". Pixel color is not background color.",0x26);
            this_00 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1b0,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"LayerContent","");
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Layer content","")
            ;
            tcu::LogImageSet::LogImageSet(&local_280,&local_2e0,&local_2a0);
            tcu::TestLog::startImageSet
                      (this_00,local_280.m_name._M_dataplus._M_p,
                       local_280.m_description._M_dataplus._M_p);
            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Layer","");
            local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"Layer","");
            tcu::LogImage::LogImage
                      (&local_240,&local_300,&local_2c0,layer,QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write(&local_240,(int)this_00,__buf,(size_t)layer);
            tcu::TestLog::endImageSet(this_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
              operator_delete(local_240.m_description._M_dataplus._M_p,
                              local_240.m_description.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
              operator_delete(local_240.m_name._M_dataplus._M_p,
                              local_240.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
              operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
              operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
              operator_delete(local_280.m_description._M_dataplus._M_p,
                              local_280.m_description.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
              operator_delete(local_280.m_name._M_dataplus._M_p,
                              local_280.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_013e98fa;
          }
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
      }
      iVar6 = iVar6 + 1;
      lVar5 = lVar5 + (ulong)uVar3;
      bVar8 = iVar2 <= iVar6;
    } while (iVar6 != iVar2);
  }
  if (logging) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Image is valid",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_013e98fa:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
  }
  return bVar8;
}

Assistant:

bool LayeredRenderCase::verifyEmptyImage (const tcu::Surface& layer, bool logging)
{
	// Expect black
	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Message << "Expecting empty image" << tcu::TestLog::EndMessage;

	for (int y = 0; y < layer.getHeight(); ++y)
	for (int x = 0; x < layer.getWidth(); ++x)
	{
		const tcu::RGBA color		= layer.getPixel(x, y);
		const int		threshold	= 8;
		const bool		isBlack		= color.getRed() <= threshold || color.getGreen() <= threshold || color.getBlue() <= threshold;

		if (!isBlack)
		{
			if (logging)
				m_testCtx.getLog()	<< tcu::TestLog::Message
									<< "Found (at least) one bad pixel at " << x << "," << y << ". Pixel color is not background color."
									<< tcu::TestLog::EndMessage
									<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
									<< tcu::TestLog::Image("Layer", "Layer", layer)
									<< tcu::TestLog::EndImageSet;
			return false;
		}
	}

	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Message << "Image is valid" << tcu::TestLog::EndMessage;

	return true;
}